

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<long_double>::TransferResidual
          (TPZTransfer<long_double> *this,TPZFMatrix<long_double> *fine,
          TPZFMatrix<long_double> *coarse)

{
  longdouble lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  longdouble *plVar5;
  int iVar6;
  ulong uVar7;
  int c;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int i;
  int iVar11;
  ulong uVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  TPZFMatrix<long_double> tempfine;
  TPZFMatrix<long_double> tempcoarse;
  
  uVar3 = (fine->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  uVar12 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  uVar4 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  iVar2 = (int)(coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  iVar11 = (int)uVar3;
  iVar8 = (int)uVar4;
  if (iVar2 == iVar11) {
    iVar6 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
    if ((long)(int)(coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow ==
        (long)iVar6 * uVar4) goto LAB_00c8474a;
  }
  else {
    iVar6 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
  }
  (*(coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(coarse,(long)(iVar6 * iVar8),(long)iVar11,(ulong)(uint)(iVar6 * iVar8));
  iVar6 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
  iVar2 = iVar11;
LAB_00c8474a:
  if (iVar6 != 1) {
    iVar6 = (int)uVar12;
    iVar10 = 0;
    uVar7 = 0;
    if (0 < iVar11) {
      uVar7 = uVar3 & 0xffffffff;
    }
    uVar3 = 0;
    if (0 < iVar8) {
      uVar3 = uVar4 & 0xffffffff;
    }
    uVar4 = 0;
    if (0 < iVar6) {
      uVar4 = uVar12 & 0xffffffff;
    }
    for (; iVar10 < *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
        iVar10 = iVar10 + 1) {
      TPZFMatrix<long_double>::TPZFMatrix(&tempcoarse,(long)iVar6,(long)iVar2);
      TPZFMatrix<long_double>::TPZFMatrix(&tempfine,(long)iVar8,(long)iVar11);
      for (uVar12 = 0; uVar12 != uVar3; uVar12 = uVar12 + 1) {
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          (*(fine->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])
                    (fine,(long)(*(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.
                                          field_0x1c * (int)uVar12 + iVar10),uVar9);
          plVar5 = TPZFMatrix<long_double>::operator()(&tempfine,uVar12,uVar9);
          *plVar5 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = in_ST7;
        }
      }
      MultiplyScalar(this,&tempfine,&tempcoarse,1);
      for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          plVar5 = TPZFMatrix<long_double>::operator()(&tempcoarse,uVar12,uVar9);
          lVar1 = *plVar5;
          plVar5 = TPZFMatrix<long_double>::operator()
                             (coarse,(long)(*(int *)&(this->super_TPZMatrix<long_double>).
                                                     super_TPZBaseMatrix.field_0x1c * (int)uVar12 +
                                           iVar10),uVar9);
          *plVar5 = lVar1;
          in_ST7 = in_ST6;
        }
      }
      TPZFMatrix<long_double>::~TPZFMatrix(&tempfine);
      TPZFMatrix<long_double>::~TPZFMatrix(&tempcoarse);
    }
    return;
  }
  MultiplyScalar(this,fine,coarse,1);
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferResidual(const TPZFMatrix<TVar> &fine, TPZFMatrix<TVar> &coarse){
	int iv;
	int nrf = fine.Rows();
	int ncf = fine.Cols();
	int nrc = coarse.Rows();
	int ncc = coarse.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(ncc != ncf || nrc != this->Cols()*fNTVarVar) {
		ncc = ncf;
		nrc = this->Cols()*fNTVarVar;
		coarse.Redim(nrc,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(fine,coarse,1);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisr,ncc), tempfine(thisc,ncf);
            for (int i=0; i<thisc; i++) {
                for (int c=0; c<ncf; c++) {
                    tempfine(i,c) = fine.GetVal(iv+i*fNTVarVar,c);
                    
                }
            }
            MultiplyScalar(tempfine, tempcoarse, 1);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    coarse(iv+i*fNTVarVar,c) = tempcoarse(i,c);
                    
                }
            }
        }
    }

}